

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_resampler.cc
# Opt level: O0

int __thiscall
webrtc::PushResampler<float>::InitializeIfNeeded
          (PushResampler<float> *this,int src_sample_rate_hz,int dst_sample_rate_hz,
          size_t num_channels)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  PushSincResampler *pPVar5;
  ulong uVar6;
  float *pfVar7;
  size_t source_frames;
  ulong destination_frames;
  size_t dst_size_10ms_mono;
  size_t src_size_10ms_mono;
  size_t num_channels_local;
  int dst_sample_rate_hz_local;
  int src_sample_rate_hz_local;
  PushResampler<float> *this_local;
  
  if (((src_sample_rate_hz == this->src_sample_rate_hz_) &&
      (dst_sample_rate_hz == this->dst_sample_rate_hz_)) && (num_channels == this->num_channels_)) {
    this_local._4_4_ = 0;
  }
  else if (((src_sample_rate_hz < 1) || (dst_sample_rate_hz < 1)) ||
          ((num_channels == 0 || (2 < num_channels)))) {
    this_local._4_4_ = -1;
  }
  else {
    this->src_sample_rate_hz_ = src_sample_rate_hz;
    this->dst_sample_rate_hz_ = dst_sample_rate_hz;
    this->num_channels_ = num_channels;
    source_frames = (size_t)(src_sample_rate_hz / 100);
    destination_frames = (ulong)(dst_sample_rate_hz / 100);
    pPVar5 = (PushSincResampler *)operator_new(0x40);
    PushSincResampler::PushSincResampler(pPVar5,source_frames,destination_frames);
    std::unique_ptr<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>::
    reset(&this->sinc_resampler_,pPVar5);
    if (this->num_channels_ == 2) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = source_frames;
      uVar6 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      pfVar7 = (float *)operator_new__(uVar6);
      std::unique_ptr<float[],std::default_delete<float[]>>::reset<float*,void>
                ((unique_ptr<float[],std::default_delete<float[]>> *)&this->src_left_,pfVar7);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = source_frames;
      uVar6 = SUB168(auVar2 * ZEXT816(4),0);
      if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      pfVar7 = (float *)operator_new__(uVar6);
      std::unique_ptr<float[],std::default_delete<float[]>>::reset<float*,void>
                ((unique_ptr<float[],std::default_delete<float[]>> *)&this->src_right_,pfVar7);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = destination_frames;
      uVar6 = SUB168(auVar3 * ZEXT816(4),0);
      if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      pfVar7 = (float *)operator_new__(uVar6);
      std::unique_ptr<float[],std::default_delete<float[]>>::reset<float*,void>
                ((unique_ptr<float[],std::default_delete<float[]>> *)&this->dst_left_,pfVar7);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = destination_frames;
      uVar6 = SUB168(auVar4 * ZEXT816(4),0);
      if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      pfVar7 = (float *)operator_new__(uVar6);
      std::unique_ptr<float[],std::default_delete<float[]>>::reset<float*,void>
                ((unique_ptr<float[],std::default_delete<float[]>> *)&this->dst_right_,pfVar7);
      pPVar5 = (PushSincResampler *)operator_new(0x40);
      PushSincResampler::PushSincResampler(pPVar5,source_frames,destination_frames);
      std::unique_ptr<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>::
      reset(&this->sinc_resampler_right_,pPVar5);
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int PushResampler<T>::InitializeIfNeeded(int src_sample_rate_hz,
                                         int dst_sample_rate_hz,
                                         size_t num_channels) {
  if (src_sample_rate_hz == src_sample_rate_hz_ &&
      dst_sample_rate_hz == dst_sample_rate_hz_ &&
      num_channels == num_channels_)
    // No-op if settings haven't changed.
    return 0;

  if (src_sample_rate_hz <= 0 || dst_sample_rate_hz <= 0 ||
      num_channels <= 0 || num_channels > 2)
    return -1;

  src_sample_rate_hz_ = src_sample_rate_hz;
  dst_sample_rate_hz_ = dst_sample_rate_hz;
  num_channels_ = num_channels;

  const size_t src_size_10ms_mono =
      static_cast<size_t>(src_sample_rate_hz / 100);
  const size_t dst_size_10ms_mono =
      static_cast<size_t>(dst_sample_rate_hz / 100);
  sinc_resampler_.reset(new PushSincResampler(src_size_10ms_mono,
                                              dst_size_10ms_mono));
  if (num_channels_ == 2) {
    src_left_.reset(new T[src_size_10ms_mono]);
    src_right_.reset(new T[src_size_10ms_mono]);
    dst_left_.reset(new T[dst_size_10ms_mono]);
    dst_right_.reset(new T[dst_size_10ms_mono]);
    sinc_resampler_right_.reset(new PushSincResampler(src_size_10ms_mono,
                                                      dst_size_10ms_mono));
  }

  return 0;
}